

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits_tests.cpp
# Opt level: O3

VersionBitsTester * __thiscall
VersionBitsTester::Mine(VersionBitsTester *this,uint height,int32_t nTime,int32_t nVersion)

{
  iterator __position;
  CBlockIndex *this_00;
  CBlockIndex *pCVar1;
  ulong uVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  long in_FS_OFFSET;
  CBlockIndex *pindex;
  CBlockIndex *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar4 = (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar3 = (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar2 = (long)ppCVar3 - (long)ppCVar4 >> 3;
  if (uVar2 < height) {
    do {
      this_00 = (CBlockIndex *)operator_new(0x98);
      memset(this_00,0,0x98);
      this_00->nHeight = (int)uVar2;
      if (ppCVar4 == ppCVar3) {
        pCVar1 = (CBlockIndex *)0x0;
      }
      else {
        pCVar1 = ppCVar3[-1];
      }
      this_00->pprev = pCVar1;
      this_00->nTime = nTime;
      this_00->nVersion = nVersion;
      local_40 = this_00;
      CBlockIndex::BuildSkip(this_00);
      __position._M_current =
           (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<CBlockIndex*,std::allocator<CBlockIndex*>>::
        _M_realloc_insert<CBlockIndex*const&>
                  ((vector<CBlockIndex*,std::allocator<CBlockIndex*>> *)&this->vpblock,__position,
                   &local_40);
        ppCVar3 = (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *__position._M_current = local_40;
        ppCVar3 = (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish + 1;
        (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppCVar3;
      }
      ppCVar4 = (this->vpblock).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar2 = (long)ppCVar3 - (long)ppCVar4 >> 3;
    } while (uVar2 < height);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

VersionBitsTester& Mine(unsigned int height, int32_t nTime, int32_t nVersion) {
        while (vpblock.size() < height) {
            CBlockIndex* pindex = new CBlockIndex();
            pindex->nHeight = vpblock.size();
            pindex->pprev = Tip();
            pindex->nTime = nTime;
            pindex->nVersion = nVersion;
            pindex->BuildSkip();
            vpblock.push_back(pindex);
        }
        return *this;
    }